

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::LearnRelatedScripts
          (LegacyScriptPubKeyMan *this,CPubKey *key,OutputType type)

{
  bool bVar1;
  int iVar2;
  pointer pDVar3;
  int in_EDX;
  long *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  CScript witprog;
  CTxDestination witdest;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffef8;
  WitnessV0KeyHash *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar4;
  SigningProvider *provider;
  CScript *script;
  CPubKey *in_stack_ffffffffffffff20;
  undefined1 local_a0 [32];
  SigningProvider local_80 [2];
  CScript local_6c [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 3) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x5d7,
                  "void wallet::LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey &, OutputType)"
                 );
  }
  bVar1 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffef8);
  if ((bVar1) && ((in_EDX == 1 || (in_EDX == 2)))) {
    provider = local_80;
    CPubKey::GetID(in_stack_ffffffffffffff20);
    script = local_6c;
    WitnessV0KeyHash::WitnessV0KeyHash
              ((WitnessV0KeyHash *)in_stack_fffffffffffffef8,(uint160 *)0xa1138f);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_ffffffffffffff0f,
                           CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
               in_stack_ffffffffffffff00);
    GetScriptForDestination(in_stack_fffffffffffffef8);
    InferDescriptor(script,provider);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                       in_stack_fffffffffffffef8);
    bVar4 = 0;
    if (bVar1) {
      pDVar3 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_fffffffffffffef8);
      iVar2 = (*pDVar3->_vptr_Descriptor[3])();
      in_stack_ffffffffffffff0e = (byte)iVar2;
      bVar4 = in_stack_ffffffffffffff0e;
    }
    if ((bVar4 & 1) == 0) {
      __assert_fail("desc && desc->IsSolvable()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5dd,
                    "void wallet::LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey &, OutputType)"
                   );
    }
    (**(code **)(*in_RDI + 0x120))(in_RDI,local_a0);
    std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
              ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
               CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
    CScript::~CScript((CScript *)in_stack_fffffffffffffef8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffef8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey& key, OutputType type)
{
    assert(type != OutputType::BECH32M);
    if (key.IsCompressed() && (type == OutputType::P2SH_SEGWIT || type == OutputType::BECH32)) {
        CTxDestination witdest = WitnessV0KeyHash(key.GetID());
        CScript witprog = GetScriptForDestination(witdest);
        // Make sure the resulting program is solvable.
        const auto desc = InferDescriptor(witprog, *this);
        assert(desc && desc->IsSolvable());
        AddCScript(witprog);
    }
}